

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall
Js::ByteCodeWriter::BrLocalProperty
          (ByteCodeWriter *this,OpCode op,ByteCodeLabel labelID,PropertyIdIndexType index)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  undefined1 local_36 [8];
  OpLayoutBrLocalProperty data;
  
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x1a);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x386,"(!OpCodeAttr::HasMultiSizeLayout(op))",
                                "!OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  CheckLabel(this,labelID);
  Data::EncodeT<(Js::LayoutSize)0>(&this->m_byteCodeData,op,this);
  Data::Write(&this->m_byteCodeData,local_36,6);
  AddJumpOffset(this,op,labelID,6);
  return;
}

Assistant:

void ByteCodeWriter::BrLocalProperty(OpCode op, ByteCodeLabel labelID, PropertyIdIndexType index)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::BrLocalProperty);
        Assert(!OpCodeAttr::HasMultiSizeLayout(op));
        CheckLabel(labelID);

        size_t const offsetOfRelativeJumpOffsetFromEnd = sizeof(OpLayoutBrLocalProperty) - offsetof(OpLayoutBrLocalProperty, RelativeJumpOffset);
        OpLayoutBrLocalProperty data;
        data.RelativeJumpOffset = offsetOfRelativeJumpOffsetFromEnd;
        data.PropertyIdIndex = index;

        m_byteCodeData.Encode(op, &data, sizeof(data), this);
        AddJumpOffset(op, labelID, offsetOfRelativeJumpOffsetFromEnd);
    }